

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::StrongWeakAssertionExpr::fromSyntax
          (StrongWeakPropertyExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  undefined4 in_EAX;
  int iVar1;
  undefined4 extraout_var;
  StrongWeakAssertionExpr *pSVar2;
  undefined8 uStack_28;
  AssertionExpr *this_00;
  
  this = ((context->scope).ptr)->compilation;
  uStack_28._0_4_ = in_EAX;
  iVar1 = AssertionExpr::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  this_00 = (AssertionExpr *)CONCAT44(extraout_var,iVar1);
  AssertionExpr::requireSequence(this_00,context);
  enforceNondegeneracy(this_00,context,Default,(SyntaxNode *)syntax);
  uStack_28 = (ulong)CONCAT14((syntax->keyword).kind != StrongKeyword,(undefined4)uStack_28);
  pSVar2 = BumpAllocator::
           emplace<slang::ast::StrongWeakAssertionExpr,slang::ast::AssertionExpr_const&,slang::ast::StrongWeakAssertionExpr::Strength>
                     (&this->super_BumpAllocator,this_00,(Strength *)((long)&uStack_28 + 4));
  return &pSVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& StrongWeakAssertionExpr::fromSyntax(const StrongWeakPropertyExprSyntax& syntax,
                                                   const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context);
    expr.requireSequence(context);
    enforceNondegeneracy(expr, context, NondegeneracyRequirement::Default, syntax);

    return *comp.emplace<StrongWeakAssertionExpr>(
        expr, syntax.keyword.kind == TokenKind::StrongKeyword ? Strong : Weak);
}